

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fRasterizationTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles2::Functional::anon_unknown_1::CullingTest::iterate(CullingTest *this)

{
  ostringstream *poVar1;
  GLenum GVar2;
  pointer pVVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  undefined4 extraout_var;
  char *pcVar10;
  RenderTarget *pRVar11;
  uint uVar12;
  int vtxNdx;
  long lVar13;
  Vec4 *pVVar14;
  Vec4 *pVVar15;
  long lVar16;
  CullingTest *pCVar17;
  float fVar18;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> drawBuffer;
  _Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  local_208;
  long local_1f0;
  Surface resultImage;
  RasterizationArguments local_1d0;
  SceneTriangle tri;
  
  iVar9 = (this->super_BaseRenderingCase).m_renderSize;
  tcu::Surface::Surface(&resultImage,iVar9,iVar9);
  drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_208._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  deRandom_init((deRandom *)&tri,0x849ea);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize(&drawBuffer,6)
  ;
  lVar13 = 0;
  for (lVar16 = 0;
      lVar16 < (int)((ulong)((long)drawBuffer.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)drawBuffer.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 4);
      lVar16 = lVar16 + 1) {
    fVar18 = deRandom_getFloat((deRandom *)&tri);
    *(float *)((long)(drawBuffer.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar13) =
         fVar18 * 1.8 + -0.9;
    fVar18 = deRandom_getFloat((deRandom *)&tri);
    *(float *)((long)(drawBuffer.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar13 + 4) =
         fVar18 * 1.8 + -0.9;
    *(undefined8 *)
     ((long)(drawBuffer.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start)->m_data + lVar13 + 8) = 0x3f80000000000000;
    lVar13 = lVar13 + 0x10;
  }
  if (this->m_cullMode != 0x408) {
    bVar7 = (this->m_cullMode == 0x404) != (this->m_faceOrder == 0x901);
    GVar2 = this->m_primitive;
    if (GVar2 == 4) {
      iVar9 = 2;
      while( true ) {
        pVVar3 = drawBuffer.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar12 = iVar9 - 2;
        if ((int)((ulong)((long)drawBuffer.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)drawBuffer.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4) + -2 <= (int)uVar12)
        break;
        pCVar17 = (CullingTest *)
                  (drawBuffer.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + (int)uVar12);
        pVVar15 = drawBuffer.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + (long)(int)uVar12 + 1;
        pVVar14 = drawBuffer.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + iVar9;
        bVar8 = triangleOrder(pCVar17,pVVar15,pVVar14,(Vec4 *)(ulong)uVar12);
        if (bVar7 != bVar8) {
          tcu::TriangleSceneSpec::SceneTriangle::SceneTriangle(&tri);
          tri.positions[0].m_data._0_8_ =
               (pCVar17->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
               _vptr_TestNode;
          tri.positions[0].m_data._8_8_ =
               (pCVar17->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx;
          tri.sharedEdge[0] = false;
          tri.positions[1].m_data._0_8_ = *(undefined8 *)pVVar15->m_data;
          tri.positions[1].m_data._8_8_ = *(undefined8 *)(pVVar3[(long)(int)uVar12 + 1].m_data + 2);
          tri.sharedEdge[1] = false;
          tri.positions[2].m_data._0_8_ = *(undefined8 *)pVVar14->m_data;
          tri.positions[2].m_data._8_8_ = *(undefined8 *)(pVVar14->m_data + 2);
          tri.sharedEdge[2] = false;
          std::
          vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
          ::push_back((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                       *)&local_208,&tri);
        }
        iVar9 = iVar9 + 3;
      }
    }
    else if (GVar2 == 5) {
      local_1f0 = 0x200000000;
      lVar13 = 0x10;
      for (lVar16 = 0;
          pVVar3 = drawBuffer.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
          lVar16 < ((long)drawBuffer.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)drawBuffer.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) * 0x10000000 + -0x200000000 >>
                   0x20; lVar16 = lVar16 + 1) {
        pVVar15 = (Vec4 *)((long)(drawBuffer.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar13);
        pCVar17 = (CullingTest *)
                  ((long)drawBuffer.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[-1].m_data + lVar13);
        pVVar14 = (Vec4 *)((long)(drawBuffer.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_data +
                          (local_1f0 >> 0x1c));
        bVar8 = triangleOrder(pCVar17,pVVar15,pVVar14,(Vec4 *)0xfffffffe00000000);
        if (((uint)lVar16 & 1 ^ (uint)bVar7) != (uint)bVar8) {
          tcu::TriangleSceneSpec::SceneTriangle::SceneTriangle(&tri);
          tri.positions[0].m_data._0_8_ =
               (pCVar17->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
               _vptr_TestNode;
          tri.positions[0].m_data._8_8_ = *(undefined8 *)((long)pVVar3->m_data + lVar13 + -8);
          tri.sharedEdge[0] = false;
          tri.positions[1].m_data._0_8_ = *(undefined8 *)pVVar15->m_data;
          tri.positions[1].m_data._8_8_ = *(undefined8 *)(pVVar15->m_data + 2);
          tri.sharedEdge[1] = false;
          tri.positions[2].m_data._0_8_ = *(undefined8 *)pVVar14->m_data;
          tri.positions[2].m_data._8_8_ = *(undefined8 *)(pVVar14->m_data + 2);
          tri.sharedEdge[2] = false;
          std::
          vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
          ::push_back((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                       *)&local_208,&tri);
        }
        local_1f0 = local_1f0 + 0x100000000;
        lVar13 = lVar13 + 0x10;
      }
    }
    else if (GVar2 == 6) {
      lVar16 = 0x20;
      for (lVar13 = 1;
          pVVar3 = drawBuffer.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
          lVar13 < ((long)drawBuffer.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)drawBuffer.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) * 0x10000000 + -0x100000000 >>
                   0x20; lVar13 = lVar13 + 1) {
        pVVar15 = (Vec4 *)((long)(drawBuffer.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar16);
        pVVar14 = (Vec4 *)((long)drawBuffer.
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].m_data + lVar16);
        bVar8 = triangleOrder((CullingTest *)
                              drawBuffer.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,pVVar14,pVVar15,
                              (Vec4 *)0xffffffff00000000);
        if (bVar7 != bVar8) {
          tcu::TriangleSceneSpec::SceneTriangle::SceneTriangle(&tri);
          tri.positions[0].m_data._0_8_ = *(undefined8 *)pVVar3->m_data;
          tri.positions[0].m_data._8_8_ = *(undefined8 *)(pVVar3->m_data + 2);
          tri.sharedEdge[0] = false;
          tri.positions[1].m_data._0_8_ = *(undefined8 *)pVVar14->m_data;
          tri.positions[1].m_data._8_8_ = *(undefined8 *)((long)pVVar3->m_data + lVar16 + -8);
          tri.sharedEdge[1] = false;
          tri.positions[2].m_data._0_8_ = *(undefined8 *)pVVar15->m_data;
          tri.positions[2].m_data._8_8_ = *(undefined8 *)(pVVar15->m_data + 2);
          tri.sharedEdge[2] = false;
          std::
          vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
          ::push_back((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                       *)&local_208,&tri);
        }
        lVar16 = lVar16 + 0x10;
      }
    }
  }
  iVar9 = (*((this->super_BaseRenderingCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar13 = CONCAT44(extraout_var,iVar9);
  (**(code **)(lVar13 + 0x5e0))(0xb44);
  (**(code **)(lVar13 + 0x418))(this->m_cullMode);
  (**(code **)(lVar13 + 0x6c0))(this->m_faceOrder);
  tri.positions[0].m_data._0_8_ =
       ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
       m_log;
  poVar1 = (ostringstream *)(tri.positions[0].m_data + 2);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Setting front face to ");
  pcVar10 = glu::getWindingName(this->m_faceOrder);
  std::operator<<((ostream *)poVar1,pcVar10);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&tri,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  tri.positions[0].m_data._0_8_ =
       ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
       m_log;
  poVar1 = (ostringstream *)(tri.positions[0].m_data + 2);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Setting cull face to ");
  pcVar10 = glu::getFaceName(this->m_cullMode);
  std::operator<<((ostream *)poVar1,pcVar10);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&tri,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  tri.positions[0].m_data._0_8_ =
       ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
       m_log;
  poVar1 = (ostringstream *)(tri.positions[0].m_data + 2);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Drawing test pattern (");
  pcVar10 = glu::getPrimitiveTypeName(this->m_primitive);
  std::operator<<((ostream *)poVar1,pcVar10);
  std::operator<<((ostream *)poVar1,")");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&tri,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  BaseRenderingCase::drawPrimitives
            (&this->super_BaseRenderingCase,&resultImage,&drawBuffer,this->m_primitive);
  tri.positions[1].m_data[0] = 0.0;
  tri.positions[1].m_data[1] = 0.0;
  tri.positions[0].m_data[0] = 0.0;
  tri.positions[0].m_data[1] = 0.0;
  tri.positions[0].m_data[2] = 0.0;
  tri.positions[0].m_data[3] = 0.0;
  local_1d0.numSamples = (this->super_BaseRenderingCase).m_numSamples;
  local_1d0.subpixelBits = (this->super_BaseRenderingCase).m_subpixelBits;
  pRVar11 = Context::getRenderTarget((this->super_BaseRenderingCase).super_TestCase.m_context);
  local_1d0.redBits = (pRVar11->m_pixelFormat).redBits;
  pRVar11 = Context::getRenderTarget((this->super_BaseRenderingCase).super_TestCase.m_context);
  local_1d0.greenBits = (pRVar11->m_pixelFormat).greenBits;
  pRVar11 = Context::getRenderTarget((this->super_BaseRenderingCase).super_TestCase.m_context);
  uVar6 = tri.positions[1].m_data._0_8_;
  uVar5 = tri.positions[0].m_data._8_8_;
  uVar4 = tri.positions[0].m_data._0_8_;
  local_1d0.blueBits = (pRVar11->m_pixelFormat).blueBits;
  tri.positions[1].m_data._0_8_ = local_208._M_impl.super__Vector_impl_data._M_end_of_storage;
  tri.positions[0].m_data._0_8_ = local_208._M_impl.super__Vector_impl_data._M_start;
  tri.positions[0].m_data._8_8_ = local_208._M_impl.super__Vector_impl_data._M_finish;
  local_208._M_impl.super__Vector_impl_data._M_start = (pointer)uVar4;
  local_208._M_impl.super__Vector_impl_data._M_finish = (pointer)uVar5;
  local_208._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)uVar6;
  bVar7 = tcu::verifyTriangleGroupRasterization
                    (&resultImage,(TriangleSceneSpec *)&tri,&local_1d0,
                     ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                     m_testCtx)->m_log,VERIFICATIONMODE_WEAK);
  pcVar10 = "Incorrect rendering";
  if (bVar7) {
    pcVar10 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             (uint)!bVar7,pcVar10);
  std::
  _Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ::~_Vector_base((_Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                   *)&tri);
  std::
  _Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ::~_Vector_base(&local_208);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&drawBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  tcu::Surface::~Surface(&resultImage);
  return STOP;
}

Assistant:

CullingTest::IterateResult CullingTest::iterate (void)
{
	tcu::Surface									resultImage(m_renderSize, m_renderSize);
	std::vector<tcu::Vec4>							drawBuffer;
	std::vector<TriangleSceneSpec::SceneTriangle>	triangles;

	// generate scene
	generateVertices(drawBuffer);
	extractTriangles(triangles, drawBuffer);

	// draw image
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		gl.enable(GL_CULL_FACE);
		gl.cullFace(m_cullMode);
		gl.frontFace(m_faceOrder);

		m_testCtx.getLog() << tcu::TestLog::Message << "Setting front face to " << glu::getWindingName(m_faceOrder) << tcu::TestLog::EndMessage;
		m_testCtx.getLog() << tcu::TestLog::Message << "Setting cull face to " << glu::getFaceName(m_cullMode) << tcu::TestLog::EndMessage;
		m_testCtx.getLog() << tcu::TestLog::Message << "Drawing test pattern (" << glu::getPrimitiveTypeName(m_primitive) << ")" << tcu::TestLog::EndMessage;

		drawPrimitives(resultImage, drawBuffer, m_primitive);
	}

	// compare
	{
		RasterizationArguments	args;
		TriangleSceneSpec		scene;

		args.numSamples		= m_numSamples;
		args.subpixelBits	= m_subpixelBits;
		args.redBits		= m_context.getRenderTarget().getPixelFormat().redBits;
		args.greenBits		= m_context.getRenderTarget().getPixelFormat().greenBits;
		args.blueBits		= m_context.getRenderTarget().getPixelFormat().blueBits;

		scene.triangles.swap(triangles);

		if (verifyTriangleGroupRasterization(resultImage, scene, args, m_testCtx.getLog(), tcu::VERIFICATIONMODE_WEAK))
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Incorrect rendering");
	}

	return STOP;
}